

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

void __thiscall FIX::DataDictionary::DataDictionary(DataDictionary *this,DataDictionary *copy)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_DataDictionary = (_func_int **)&PTR__DataDictionary_001ee998;
  BeginString::BeginString(&this->m_beginString);
  p_Var1 = &(this->m_messageFields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_messageFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_messageFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_messageFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_messageFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_messageFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_requiredFields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_requiredFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_requiredFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_requiredFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_requiredFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_requiredFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_messages)._M_t._M_impl.super__Rb_tree_header;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_fields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_orderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_orderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_orderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_orderedFieldsArray).m_mode = normal;
  *(undefined8 *)&(this->m_orderedFieldsArray).m_delim = 0;
  *(undefined8 *)((long)&(this->m_orderedFieldsArray).m_groupOrder.m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_orderedFieldsArray).m_groupOrder.m_buffer + 4) = 0;
  p_Var1 = &(this->m_headerFields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_trailerFields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_names)._M_t._M_impl.super__Rb_tree_header;
  (this->m_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_valueNames)._M_t._M_impl.super__Rb_tree_header;
  (this->m_valueNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_valueNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_valueNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_valueNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_valueNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_nameValues)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nameValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_nameValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_nameValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_nameValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_nameValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_dataFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_dataFields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dataFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dataFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_dataFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_headerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_headerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dataFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_headerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_headerOrder).m_mode = normal;
  *(undefined8 *)((long)&(this->m_headerOrder).m_groupOrder.m_buffer + 4) = 0;
  *(undefined8 *)&(this->m_headerOrder).m_delim = 0;
  *(undefined8 *)((long)&(this->m_headerOrder).m_groupOrder.m_size + 4) = 0;
  (this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_trailerOrder).m_mode = normal;
  *(undefined8 *)&(this->m_trailerOrder).m_delim = 0;
  *(undefined8 *)((long)&(this->m_trailerOrder).m_groupOrder.m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_trailerOrder).m_groupOrder.m_buffer + 4) = 0;
  p_Var1 = &(this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header;
  (this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  operator=(this,copy);
  return;
}

Assistant:

DataDictionary::DataDictionary( const DataDictionary& copy )
{
  *this = copy;
}